

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O1

void duckdb::ParquetScanFunction::ParquetScanSerialize(Serializer *serializer,long param_2)

{
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this;
  long lVar1;
  char cVar2;
  pointer pTVar3;
  MultiFileList *pMVar4;
  OpenFileInfo *file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  files;
  __alloc_node_gen_t __alloc_node_gen;
  ParquetOptionsSerialization serialization;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>_>_>
  local_1f0;
  ParquetOptions local_1e8;
  long local_1a8;
  ParquetOptionsSerialization local_1a0;
  undefined1 local_c8 [64];
  _Alloc_hider local_88;
  char local_78 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_1a8 = param_2;
  optional_ptr<duckdb::FunctionData,_true>::CheckValid
            ((optional_ptr<duckdb::FunctionData,_true> *)&local_1a8);
  lVar1 = local_1a8;
  pTVar3 = unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>,_true>
           ::operator->((unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>,_true>
                         *)(local_1a8 + 0x20));
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pMVar4 = shared_ptr<duckdb::MultiFileList,_true>::operator->
                     ((shared_ptr<duckdb::MultiFileList,_true> *)(lVar1 + 0x28));
  (**(code **)(*(long *)pMVar4 + 0x20))(&local_1a0,pMVar4);
  for (; (element_type *)local_1a0.parquet_options._0_8_ !=
         local_1a0.parquet_options.encryption_config.internal.
         super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_1a0.parquet_options._0_8_ =
           &(((element_type *)local_1a0.parquet_options._0_8_)->column_keys)._M_h._M_before_begin) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_208,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_1a0.parquet_options._0_8_);
  }
  std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector
            ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)&local_1a0);
  (**(code **)(*(long *)serializer + 0x10))(serializer,100,"files");
  Serializer::WriteValue<std::__cxx11::string>
            (serializer,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)&local_208);
  (**(code **)(*(long *)serializer + 0x18))(serializer);
  (**(code **)(*(long *)serializer + 0x10))(serializer,0x65,"types");
  Serializer::WriteValue<duckdb::LogicalType>
            (serializer,(vector<duckdb::LogicalType,_true> *)(lVar1 + 0x130));
  (**(code **)(*(long *)serializer + 0x18))(serializer);
  (**(code **)(*(long *)serializer + 0x10))(serializer,0x66,"names");
  Serializer::WriteValue<std::__cxx11::string>
            (serializer,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)(lVar1 + 0x148));
  (**(code **)(*(long *)serializer + 0x18))(serializer);
  local_1e8._0_2_ = *(undefined2 *)(pTVar3 + 0x38);
  local_1e8.encryption_config.internal.
  super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)(pTVar3 + 0x40);
  local_1e8.encryption_config.internal.
  super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pTVar3 + 0x48);
  if (local_1e8.encryption_config.internal.
      super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1e8.encryption_config.internal.
       super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1e8.encryption_config.internal.
            super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1e8.encryption_config.internal.
       super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1e8.encryption_config.internal.
            super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_1e8.debug_use_openssl = *(bool *)(pTVar3 + 0x50);
  std::vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>::
  vector(&local_1e8.schema.
          super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
         ,(vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
           *)(pTVar3 + 0x58));
  local_1e8.explicit_cardinality = *(idx_t *)(pTVar3 + 0x70);
  local_c8._0_4_ = *(undefined4 *)(lVar1 + 0x98);
  this = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          *)(local_c8 + 8);
  local_c8._4_2_ = *(undefined2 *)(lVar1 + 0x9c);
  local_c8._8_8_ = (__buckets_ptr)0x0;
  local_c8._16_8_ = *(size_type *)(lVar1 + 0xa8);
  local_c8._24_8_ = (_Hash_node_base *)0x0;
  local_c8._32_8_ = *(size_type *)(lVar1 + 0xb8);
  local_c8._40_8_ = *(undefined8 *)(lVar1 + 0xc0);
  local_c8._48_8_ = *(size_t *)(lVar1 + 200);
  local_c8._56_8_ = (__node_base_ptr)0x0;
  local_1f0._M_h = (__hashtable_alloc *)this;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::LogicalType>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)this,(_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)(lVar1 + 0xa0),&local_1f0);
  local_88._M_p = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,*(long *)(lVar1 + 0xd8),
             *(long *)(lVar1 + 0xe0) + *(long *)(lVar1 + 0xd8));
  local_68._M_buckets = (__buckets_ptr)0x0;
  local_68._M_bucket_count = *(size_type *)(lVar1 + 0x100);
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = *(size_type *)(lVar1 + 0x110);
  local_68._M_rehash_policy._0_8_ = *(undefined8 *)(lVar1 + 0x118);
  local_68._M_rehash_policy._M_next_resize = *(size_t *)(lVar1 + 0x120);
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_1f0._M_h = (__hashtable_alloc *)&local_68;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::Value>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_68,
             (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)(lVar1 + 0xf8),
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>
              *)&local_1f0);
  ParquetOptionsSerialization::ParquetOptionsSerialization
            (&local_1a0,&local_1e8,(MultiFileOptions *)local_c8);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  if (local_88._M_p != local_78) {
    operator_delete(local_88._M_p);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(this);
  std::vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>::
  ~vector(&local_1e8.schema.
           super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
         );
  if (local_1e8.encryption_config.internal.
      super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1e8.encryption_config.internal.
               super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  Serializer::WriteProperty<duckdb::ParquetOptionsSerialization>
            (serializer,0x67,"parquet_options",&local_1a0);
  cVar2 = duckdb::SerializationCompatibility::Compare((ulong)(serializer + 0x10));
  if (cVar2 != '\0') {
    (**(code **)(*(long *)serializer + 0x10))(serializer,0x68,"table_columns");
    Serializer::WriteValue<std::__cxx11::string>
              (serializer,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)(lVar1 + 0x198));
    (**(code **)(*(long *)serializer + 0x18))(serializer);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_1a0.file_options.custom_options._M_h);
  if (local_1a0.file_options.filename_column._M_dataplus._M_p != (pointer)((long)&local_1a0 + 0x90U)
     ) {
    operator_delete(local_1a0.file_options.filename_column._M_dataplus._M_p);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)((long)&local_1a0 + 0x48));
  std::vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>::
  ~vector((vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
           *)((long)&local_1a0 + 0x20));
  if (local_1a0.parquet_options.encryption_config.internal.
      super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1a0.parquet_options.encryption_config.internal.
               super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_208);
  return;
}

Assistant:

static void ParquetScanSerialize(Serializer &serializer, const optional_ptr<FunctionData> bind_data_p,
	                                 const TableFunction &function) {
		auto &bind_data = bind_data_p->Cast<MultiFileBindData>();
		auto &parquet_data = bind_data.bind_data->Cast<ParquetReadBindData>();

		vector<string> files;
		for (auto &file : bind_data.file_list->GetAllFiles()) {
			files.emplace_back(file.path);
		}
		serializer.WriteProperty(100, "files", files);
		serializer.WriteProperty(101, "types", bind_data.types);
		serializer.WriteProperty(102, "names", bind_data.names);
		ParquetOptionsSerialization serialization(parquet_data.parquet_options, bind_data.file_options);
		serializer.WriteProperty(103, "parquet_options", serialization);
		if (serializer.ShouldSerialize(3)) {
			serializer.WriteProperty(104, "table_columns", bind_data.table_columns);
		}
	}